

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

int archive_write_zip_close(archive_write *a)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined4 uVar6;
  ulong uVar7;
  int iVar8;
  undefined8 *puVar9;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  long lStack_50;
  ulong local_48;
  undefined8 uStack_40;
  
  pvVar1 = a->format_data;
  uVar2 = *(ulong *)((long)pvVar1 + 0x88);
  uVar7 = uVar2;
  for (puVar9 = *(undefined8 **)((long)pvVar1 + 0x68); puVar9 != (undefined8 *)0x0;
      puVar9 = (undefined8 *)*puVar9) {
    iVar3 = __archive_write_output(a,(void *)puVar9[2],puVar9[3] - (long)puVar9[2]);
    if (iVar3 != 0) {
      return -0x1e;
    }
    uVar7 = (puVar9[3] - puVar9[2]) + *(long *)((long)pvVar1 + 0x88);
    *(ulong *)((long)pvVar1 + 0x88) = uVar7;
  }
  lVar5 = uVar7 - uVar2;
  uVar4 = *(ulong *)((long)pvVar1 + 0x80);
  uVar6 = (undefined4)lVar5;
  if (((0xffff < uVar4 || 0xffffffff < (long)uVar2) || 0xffffffff < lVar5) ||
     ((*(byte *)((long)pvVar1 + 0xa8) & 2) != 0)) {
    local_68 = 0;
    local_78 = 0x6064b50;
    uStack_6f = 0;
    uStack_6e = 0;
    uStack_6d = 0;
    uStack_6c = 0x2d;
    uStack_6b = 0;
    uStack_6a = 0x2d;
    uStack_69 = 0;
    uStack_74 = 0x2c;
    uStack_70 = 0;
    uStack_60 = uVar4;
    local_58 = uVar4;
    lStack_50 = lVar5;
    local_48 = uVar2;
    iVar3 = __archive_write_output(a,&local_78,0x38);
    if (iVar3 != 0) {
      return -0x1e;
    }
    *(long *)((long)pvVar1 + 0x88) = *(long *)((long)pvVar1 + 0x88) + 0x38;
    local_78 = 0x7064b50;
    uStack_74 = 0;
    uStack_70 = (undefined1)uVar7;
    uStack_6f = (undefined1)(uVar7 >> 8);
    uStack_6e = (undefined1)(uVar7 >> 0x10);
    uStack_6d = (undefined1)(uVar7 >> 0x18);
    uStack_6c = (undefined1)(uVar7 >> 0x20);
    uStack_6b = (undefined1)(uVar7 >> 0x28);
    uStack_6a = (undefined1)(uVar7 >> 0x30);
    uStack_69 = (undefined1)(uVar7 >> 0x38);
    local_68 = CONCAT44(local_68._4_4_,1);
    iVar3 = __archive_write_output(a,&local_78,0x14);
    if (iVar3 != 0) {
      return -0x1e;
    }
    *(long *)((long)pvVar1 + 0x88) = *(long *)((long)pvVar1 + 0x88) + 0x14;
    uVar4 = *(ulong *)((long)pvVar1 + 0x80);
  }
  uStack_74 = 0;
  uStack_60 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  lStack_50 = 0;
  uVar7 = 0xffff;
  if (uVar4 < 0xffff) {
    uVar7 = uVar4;
  }
  local_78 = 0x6054b50;
  uStack_70 = (undefined1)uVar7;
  uStack_6f = (undefined1)(uVar7 >> 8);
  if (0xfffffffe < lVar5) {
    uVar6 = 0xffffffff;
  }
  uStack_6c = (undefined1)uVar6;
  uStack_6b = (undefined1)((uint)uVar6 >> 8);
  uStack_6a = (undefined1)((uint)uVar6 >> 0x10);
  local_68 = 0xffffffff;
  if ((long)uVar2 < 0xffffffff) {
    local_68 = uVar2;
  }
  uStack_69 = (undefined1)((uint)uVar6 >> 0x18);
  local_68 = local_68 & 0xffffffff;
  uStack_6e = uStack_70;
  uStack_6d = uStack_6f;
  iVar3 = __archive_write_output(a,&local_78,0x16);
  iVar8 = -0x1e;
  if (iVar3 == 0) {
    *(long *)((long)pvVar1 + 0x88) = *(long *)((long)pvVar1 + 0x88) + 0x16;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int
archive_write_zip_close(struct archive_write *a)
{
	uint8_t buff[64];
	int64_t offset_start, offset_end;
	struct zip *zip = a->format_data;
	struct cd_segment *segment;
	int ret;

	offset_start = zip->written_bytes;
	segment = zip->central_directory;
	while (segment != NULL) {
		ret = __archive_write_output(a,
		    segment->buff, segment->p - segment->buff);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->written_bytes += segment->p - segment->buff;
		segment = segment->next;
	}
	offset_end = zip->written_bytes;

	/* If central dir info is too large, write Zip64 end-of-cd */
	if (offset_end - offset_start > ARCHIVE_LITERAL_LL(0xffffffff)
	    || offset_start > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->central_directory_entries > 0xffffUL
	    || (zip->flags & ZIP_FLAG_FORCE_ZIP64)) {
	  /* Zip64 end-of-cd record */
	  memset(buff, 0, 56);
	  memcpy(buff, "PK\006\006", 4);
	  archive_le64enc(buff + 4, 44);
	  archive_le16enc(buff + 12, 45);
	  archive_le16enc(buff + 14, 45);
	  /* This is disk 0 of 0. */
	  archive_le64enc(buff + 24, zip->central_directory_entries);
	  archive_le64enc(buff + 32, zip->central_directory_entries);
	  archive_le64enc(buff + 40, offset_end - offset_start);
	  archive_le64enc(buff + 48, offset_start);
	  ret = __archive_write_output(a, buff, 56);
	  if (ret != ARCHIVE_OK)
		  return (ARCHIVE_FATAL);
	  zip->written_bytes += 56;

	  /* Zip64 end-of-cd locator record. */
	  memset(buff, 0, 20);
	  memcpy(buff, "PK\006\007", 4);
	  archive_le32enc(buff + 4, 0);
	  archive_le64enc(buff + 8, offset_end);
	  archive_le32enc(buff + 16, 1);
	  ret = __archive_write_output(a, buff, 20);
	  if (ret != ARCHIVE_OK)
		  return (ARCHIVE_FATAL);
	  zip->written_bytes += 20;

	}

	/* Format and write end of central directory. */
	memset(buff, 0, sizeof(buff));
	memcpy(buff, "PK\005\006", 4);
	archive_le16enc(buff + 8, zipmin(0xffffU, zip->central_directory_entries));
	archive_le16enc(buff + 10, zipmin(0xffffU, zip->central_directory_entries));
	archive_le32enc(buff + 12, (uint32_t)zipmin(ARCHIVE_LITERAL_LL(0xffffffff), (offset_end - offset_start)));
	archive_le32enc(buff + 16, (uint32_t)zipmin(ARCHIVE_LITERAL_LL(0xffffffff), offset_start));
	ret = __archive_write_output(a, buff, 22);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 22;
	return (ARCHIVE_OK);
}